

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.h
# Opt level: O1

void secp256k1_musig_aggnonce_save(secp256k1_musig_aggnonce *nonce,secp256k1_ge *ges)

{
  uchar *buf;
  long lVar1;
  
  nonce->data[0] = 0xa8;
  nonce->data[1] = 0xb7;
  nonce->data[2] = 0xe4;
  nonce->data[3] = 'g';
  lVar1 = 0;
  do {
    buf = nonce->data + lVar1 + 4;
    if (ges->infinity == 0) {
      secp256k1_ge_to_bytes(buf,ges);
    }
    else {
      buf[0x30] = '\0';
      buf[0x31] = '\0';
      buf[0x32] = '\0';
      buf[0x33] = '\0';
      buf[0x34] = '\0';
      buf[0x35] = '\0';
      buf[0x36] = '\0';
      buf[0x37] = '\0';
      buf[0x38] = '\0';
      buf[0x39] = '\0';
      buf[0x3a] = '\0';
      buf[0x3b] = '\0';
      buf[0x3c] = '\0';
      buf[0x3d] = '\0';
      buf[0x3e] = '\0';
      buf[0x3f] = '\0';
      buf[0x20] = '\0';
      buf[0x21] = '\0';
      buf[0x22] = '\0';
      buf[0x23] = '\0';
      buf[0x24] = '\0';
      buf[0x25] = '\0';
      buf[0x26] = '\0';
      buf[0x27] = '\0';
      buf[0x28] = '\0';
      buf[0x29] = '\0';
      buf[0x2a] = '\0';
      buf[0x2b] = '\0';
      buf[0x2c] = '\0';
      buf[0x2d] = '\0';
      buf[0x2e] = '\0';
      buf[0x2f] = '\0';
      buf[0x10] = '\0';
      buf[0x11] = '\0';
      buf[0x12] = '\0';
      buf[0x13] = '\0';
      buf[0x14] = '\0';
      buf[0x15] = '\0';
      buf[0x16] = '\0';
      buf[0x17] = '\0';
      buf[0x18] = '\0';
      buf[0x19] = '\0';
      buf[0x1a] = '\0';
      buf[0x1b] = '\0';
      buf[0x1c] = '\0';
      buf[0x1d] = '\0';
      buf[0x1e] = '\0';
      buf[0x1f] = '\0';
      buf[0] = '\0';
      buf[1] = '\0';
      buf[2] = '\0';
      buf[3] = '\0';
      buf[4] = '\0';
      buf[5] = '\0';
      buf[6] = '\0';
      buf[7] = '\0';
      buf[8] = '\0';
      buf[9] = '\0';
      buf[10] = '\0';
      buf[0xb] = '\0';
      buf[0xc] = '\0';
      buf[0xd] = '\0';
      buf[0xe] = '\0';
      buf[0xf] = '\0';
    }
    lVar1 = lVar1 + 0x40;
    ges = ges + 1;
  } while (lVar1 == 0x40);
  return;
}

Assistant:

static void secp256k1_musig_aggnonce_save(secp256k1_musig_aggnonce* nonce, const secp256k1_ge* ges) {
    int i;
    memcpy(&nonce->data[0], secp256k1_musig_aggnonce_magic, 4);
    for (i = 0; i < 2; i++) {
        secp256k1_ge_to_bytes_ext(&nonce->data[4 + 64*i], &ges[i]);
    }
}